

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O0

void __thiscall
dg::LLVMDependenceGraph::computeNTSCD
          (LLVMDependenceGraph *this,LLVMControlDependenceAnalysisOptions *opts)

{
  bool bVar1;
  mapped_type *ppBVar2;
  reference ppVVar3;
  long in_RDI;
  LLVMNode *ind;
  LLVMNode *depnd;
  Value *dep_1;
  iterator __end4;
  iterator __begin4;
  ValVec *__range4;
  Instruction *I;
  iterator __end3_1;
  iterator __begin3_1;
  BasicBlock *__range3_1;
  BBlock<dg::LLVMNode> *depbb;
  Value *dep;
  iterator __end3;
  iterator __begin3;
  ValVec *__range3;
  BBlock<dg::LLVMNode> *bb;
  BasicBlock *BB;
  iterator __end2;
  iterator __begin2;
  Function *__range2;
  BBlocksMapT *blocks;
  pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*> *it;
  const_iterator __end1;
  const_iterator __begin1;
  map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
  *__range1;
  LLVMControlDependenceAnalysis ntscd;
  LLVMNode *in_stack_fffffffffffffe08;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *this_00;
  BBlock<dg::LLVMNode> *in_stack_fffffffffffffe18;
  BBlock<dg::LLVMNode> *in_stack_fffffffffffffe20;
  Module *in_stack_fffffffffffffe28;
  LLVMControlDependenceAnalysis *in_stack_fffffffffffffe30;
  __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
  local_1c8 [2];
  key_type *in_stack_fffffffffffffe48;
  map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
  *in_stack_fffffffffffffe50;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
  local_198;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
  local_190;
  reference local_188;
  mapped_type local_180;
  Value *local_178;
  Value **local_170;
  __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
  local_168;
  undefined1 local_160 [24];
  undefined1 *local_148;
  reference local_140;
  mapped_type local_138;
  reference local_130;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
  local_128;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
  local_120;
  ret_type local_118;
  BBlocksMapT *local_110;
  reference local_108;
  _Self local_100;
  _Self local_f8;
  map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
  *local_f0;
  
  this_00 = *(Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> **)(in_RDI + 0x140);
  LLVMControlDependenceAnalysisOptions::LLVMControlDependenceAnalysisOptions
            ((LLVMControlDependenceAnalysisOptions *)this_00,
             (LLVMControlDependenceAnalysisOptions *)in_stack_fffffffffffffe08);
  LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (LLVMControlDependenceAnalysisOptions *)in_stack_fffffffffffffe20,
             (LLVMPointerAnalysis *)in_stack_fffffffffffffe18);
  LLVMControlDependenceAnalysisOptions::~LLVMControlDependenceAnalysisOptions
            ((LLVMControlDependenceAnalysisOptions *)this_00);
  local_f0 = getConstructedFunctions();
  local_f8._M_node =
       (_Base_ptr)
       std::
       map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
       ::begin((map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
                *)in_stack_fffffffffffffe08);
  local_100._M_node =
       (_Base_ptr)
       std::
       map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
       ::end((map<llvm::Value_*,_dg::LLVMDependenceGraph_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>_>
              *)in_stack_fffffffffffffe08);
  while( true ) {
    bVar1 = std::operator!=(&local_f8,&local_100);
    if (!bVar1) break;
    local_108 = std::
                _Rb_tree_const_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>::
                operator*((_Rb_tree_const_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>
                           *)0x17edad);
    local_110 = DependenceGraph<dg::LLVMNode>::getBlocks
                          (&local_108->second->super_DependenceGraph<dg::LLVMNode>);
    local_118 = llvm::cast<llvm::Function,llvm::Value>((Value *)0x17edde);
    local_120.NodePtr = (node_pointer)llvm::Function::begin((Function *)in_stack_fffffffffffffe08);
    local_128.NodePtr = (node_pointer)llvm::Function::end((Function *)in_stack_fffffffffffffe08);
    while( true ) {
      bVar1 = llvm::operator!=(&local_120,&local_128);
      if (!bVar1) break;
      local_140 = llvm::
                  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                  ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                               *)0x17ee3b);
      local_130 = local_140;
      ppBVar2 = std::
                map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
                ::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      local_138 = *ppBVar2;
      LLVMControlDependenceAnalysis::getDependencies
                ((LLVMControlDependenceAnalysis *)in_stack_fffffffffffffe18,(BasicBlock *)this_00);
      local_148 = local_160;
      local_168._M_current =
           (Value **)
           std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::begin
                     ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)
                      in_stack_fffffffffffffe08);
      local_170 = (Value **)
                  std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::end
                            ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)
                             in_stack_fffffffffffffe08);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                            *)this_00,
                           (__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                            *)in_stack_fffffffffffffe08);
        if (!bVar1) break;
        ppVVar3 = __gnu_cxx::
                  __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                  ::operator*(&local_168);
        local_178 = *ppVVar3;
        ppBVar2 = std::
                  map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
                  ::operator[](in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        local_180 = *ppBVar2;
        BBlock<dg::LLVMNode>::addControlDependence
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        __gnu_cxx::
        __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
        ::operator++(&local_168);
      }
      std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::~vector
                ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)in_stack_fffffffffffffe20)
      ;
      local_188 = local_130;
      local_190.NodePtr =
           (node_pointer)llvm::BasicBlock::begin((BasicBlock *)in_stack_fffffffffffffe08);
      local_198.NodePtr =
           (node_pointer)llvm::BasicBlock::end((BasicBlock *)in_stack_fffffffffffffe08);
      while( true ) {
        bVar1 = llvm::operator!=(&local_190,&local_198);
        if (!bVar1) break;
        llvm::
        ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
        ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                     *)0x17ef95);
        LLVMControlDependenceAnalysis::getDependencies
                  ((LLVMControlDependenceAnalysis *)in_stack_fffffffffffffe18,(Instruction *)this_00
                  );
        local_1c8[0]._M_current =
             (Value **)
             std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::begin
                       ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)
                        in_stack_fffffffffffffe08);
        std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::end
                  ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)
                   in_stack_fffffffffffffe08);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                              *)this_00,
                             (__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                              *)in_stack_fffffffffffffe08);
          if (!bVar1) break;
          __gnu_cxx::
          __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
          ::operator*(local_1c8);
          in_stack_fffffffffffffe20 =
               (BBlock<dg::LLVMNode> *)
               DependenceGraph<dg::LLVMNode>::getNode
                         ((DependenceGraph<dg::LLVMNode> *)this_00,(KeyT)in_stack_fffffffffffffe08);
          in_stack_fffffffffffffe18 =
               (BBlock<dg::LLVMNode> *)
               DependenceGraph<dg::LLVMNode>::getNode
                         ((DependenceGraph<dg::LLVMNode> *)this_00,(KeyT)in_stack_fffffffffffffe08);
          Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addControlDependence
                    (this_00,in_stack_fffffffffffffe08);
          __gnu_cxx::
          __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
          ::operator++(local_1c8);
        }
        std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::~vector
                  ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)
                   in_stack_fffffffffffffe20);
        llvm::
        ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
        ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                      *)this_00);
      }
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
      ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                    *)this_00);
    }
    std::_Rb_tree_const_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_>::
    operator++((_Rb_tree_const_iterator<std::pair<llvm::Value_*const,_dg::LLVMDependenceGraph_*>_> *
               )this_00);
  }
  LLVMControlDependenceAnalysis::~LLVMControlDependenceAnalysis
            ((LLVMControlDependenceAnalysis *)this_00);
  return;
}

Assistant:

void LLVMDependenceGraph::computeNTSCD(
        const LLVMControlDependenceAnalysisOptions &opts) {
    DBG_SECTION_BEGIN(llvmdg, "Filling in CDA edges (NTSCD)");
    dg::LLVMControlDependenceAnalysis ntscd(this->module, opts);
    assert(opts.ntscdCD() || opts.ntscd2CD());

    for (const auto &it : getConstructedFunctions()) {
        auto &blocks = it.second->getBlocks();
        for (auto &BB : *llvm::cast<llvm::Function>(it.first)) {
            auto *bb = blocks[&BB];
            assert(bb);
            for (auto *dep : ntscd.getDependencies(&BB)) {
                auto *depbb = blocks[dep];
                assert(depbb);
                depbb->addControlDependence(bb);
            }

            for (auto &I : BB) {
                for (auto *dep : ntscd.getDependencies(&I)) {
                    auto *depnd = it.second->getNode(dep);
                    assert(depnd);
                    auto *ind = it.second->getNode(&I);
                    assert(ind);
                    depnd->addControlDependence(ind);
                }
            }
        }
    }

    DBG_SECTION_END(llvmdg, "Done computing CDA edges");
}